

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O2

CURLcode cr_chunked_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                        _Bool *peos)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  void *pvVar3;
  curl_slist *pcVar4;
  Curl_easy *data_00;
  _Bool _Var5;
  CURLcode CVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  size_t len;
  size_t sVar10;
  bufq *pbVar11;
  curl_slist **ppcVar12;
  char *pcVar13;
  _Bool eos;
  Curl_easy *local_480;
  bufq *local_478;
  size_t local_470;
  bufq *local_468;
  size_t nread;
  char hd [11];
  char tmp [1024];
  
  pvVar1 = reader->ctx;
  *pnread = 0;
  *peos = (_Bool)(*(byte *)((long)pvVar1 + 0x60) >> 1 & 1);
  if ((*(byte *)((long)pvVar1 + 0x60) & 2) == 0) {
    if (((*(byte *)((long)pvVar1 + 0x60) & 1) == 0) &&
       (_Var5 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x20)), _Var5)) {
      local_478 = (bufq *)reader->ctx;
      sVar10 = 0x10000;
      if (blen < 0x10000) {
        sVar10 = blen;
      }
      sVar10 = sVar10 - 0xc;
      if (blen < 0x400) {
        sVar10 = 0x400;
      }
      pcVar13 = tmp;
      if (blen >= 0x400) {
        pcVar13 = buf;
      }
      local_480 = data;
      CVar6 = Curl_creader_read(data,reader->next,pcVar13,sVar10,&nread,&eos);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      if (eos == true) {
        *(byte *)&local_478[1].chunk_count = (byte)local_478[1].chunk_count | 1;
      }
      if (nread != 0) {
        hd[0] = '\0';
        hd[1] = '\0';
        hd[2] = '\0';
        hd[3] = '\0';
        hd[4] = '\0';
        hd[5] = '\0';
        hd[6] = '\0';
        hd[7] = '\0';
        hd[8] = '\0';
        hd[9] = '\0';
        hd[10] = '\0';
        uVar7 = curl_msnprintf(hd,0xb,"%zx\r\n");
        if ((int)uVar7 < 1) {
          return CURLE_READ_ERROR;
        }
        local_468 = (bufq *)&local_478->chunk_count;
        CVar6 = Curl_bufq_cwrite(local_468,hd,(ulong)uVar7,&local_470);
        if ((CVar6 == CURLE_OK) &&
           (CVar6 = Curl_bufq_cwrite(local_468,pcVar13,nread,&local_470), CVar6 == CURLE_OK)) {
          CVar6 = Curl_bufq_cwrite(local_468,"\r\n",2,&local_470);
        }
        if ((((local_480 != (Curl_easy *)0x0) && (((local_480->set).field_0x8cd & 0x10) != 0)) &&
            ((pcVar2 = (local_480->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
             (0 < pcVar2->log_level)))) && (0 < Curl_trc_feat_read.log_level)) {
          Curl_trc_read(local_480,"http_chunk, made chunk of %zu bytes -> %d",nread,(ulong)CVar6);
        }
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
      }
      if ((local_478[1].chunk_count & 1) != 0) {
        pvVar3 = reader->ctx;
        hd[0] = '\0';
        hd[1] = '\0';
        hd[2] = '\0';
        hd[3] = '\0';
        hd[4] = '\0';
        hd[5] = '\0';
        hd[6] = '\0';
        hd._7_4_ = hd._7_4_ & 0xffffff00;
        if ((local_480->set).trailer_callback == (curl_trailer_callback)0x0) {
          if ((((local_480->set).field_0x8cd & 0x10) != 0) &&
             (((pcVar2 = (local_480->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
               (0 < pcVar2->log_level)) && (0 < Curl_trc_feat_read.log_level)))) {
            Curl_trc_read(local_480,"http_chunk, added last, empty chunk");
          }
          CVar6 = Curl_bufq_cwrite((bufq *)((long)pvVar3 + 0x20),"0\r\n\r\n",5,&local_470);
        }
        else {
          pbVar11 = (bufq *)((long)pvVar3 + 0x20);
          CVar6 = Curl_bufq_cwrite(pbVar11,"0\r\n",3,&local_470);
          data_00 = local_480;
          if (CVar6 == CURLE_OK) {
            local_478 = pbVar11;
            Curl_set_in_callback(local_480,true);
            ppcVar12 = (curl_slist **)hd;
            iVar8 = (*(data_00->set).trailer_callback)(ppcVar12,(data_00->set).trailer_data);
            local_468 = (bufq *)CONCAT44(local_468._4_4_,iVar8);
            Curl_set_in_callback(data_00,false);
            if ((int)local_468 == 0) {
              while (pcVar4 = *ppcVar12, pcVar4 != (curl_slist *)0x0) {
                pcVar13 = pcVar4->data;
                pcVar9 = strchr(pcVar13,0x3a);
                if ((pcVar9 == (char *)0x0) || (pcVar9[1] != ' ')) {
                  if ((((local_480->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar2 = (local_480->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar2->log_level)))) {
                    Curl_infof(local_480,"Malformatted trailing header, skipping trailer");
                  }
                }
                else {
                  len = strlen(pcVar13);
                  CVar6 = Curl_bufq_cwrite(local_478,pcVar13,len,&local_470);
                  if ((CVar6 != CURLE_OK) ||
                     (CVar6 = Curl_bufq_cwrite(local_478,"\r\n",2,&local_470), CVar6 != CURLE_OK))
                  goto LAB_0013786c;
                }
                ppcVar12 = &pcVar4->next;
              }
              CVar6 = Curl_bufq_cwrite(local_478,"\r\n",2,&local_470);
            }
            else {
              Curl_failf(data_00,"operation aborted by trailing headers callback");
              CVar6 = CURLE_ABORTED_BY_CALLBACK;
            }
          }
LAB_0013786c:
          curl_slist_free_all((curl_slist *)CONCAT17(hd[7],hd._0_7_));
          if ((((local_480 != (Curl_easy *)0x0) && (((local_480->set).field_0x8cd & 0x10) != 0)) &&
              ((pcVar2 = (local_480->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
               (0 < pcVar2->log_level)))) && (0 < Curl_trc_feat_read.log_level)) {
            Curl_trc_read(local_480,"http_chunk, added last chunk with trailers from client -> %d",
                          (ulong)CVar6);
          }
        }
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
      }
    }
    pbVar11 = (bufq *)((long)pvVar1 + 0x20);
    _Var5 = Curl_bufq_is_empty(pbVar11);
    if (!_Var5) {
      CVar6 = Curl_bufq_cread(pbVar11,buf,blen,pnread);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      if (((*(byte *)((long)pvVar1 + 0x60) & 1) != 0) &&
         (_Var5 = Curl_bufq_is_empty(pbVar11), _Var5)) {
        *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) | 2;
        *peos = true;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cr_chunked_read(struct Curl_easy *data,
                                struct Curl_creader *reader,
                                char *buf, size_t blen,
                                size_t *pnread, bool *peos)
{
  struct chunked_reader *ctx = reader->ctx;
  CURLcode result = CURLE_READ_ERROR;

  *pnread = 0;
  *peos = ctx->eos;

  if(!ctx->eos) {
    if(!ctx->read_eos && Curl_bufq_is_empty(&ctx->chunkbuf)) {
      /* Still getting data form the next reader, buffer is empty */
      result = add_chunk(data, reader, buf, blen);
      if(result)
        return result;
    }

    if(!Curl_bufq_is_empty(&ctx->chunkbuf)) {
      result = Curl_bufq_cread(&ctx->chunkbuf, buf, blen, pnread);
      if(!result && ctx->read_eos && Curl_bufq_is_empty(&ctx->chunkbuf)) {
        /* no more data, read all, done. */
        ctx->eos = TRUE;
        *peos = TRUE;
      }
      return result;
    }
  }
  /* We may get here, because we are done or because callbacks paused */
  DEBUGASSERT(ctx->eos || !ctx->read_eos);
  return CURLE_OK;
}